

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  EXRHeader *exr_header;
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long *plVar5;
  pointer pOVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong __n;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong *puVar18;
  bool bVar19;
  int local_f4;
  allocator local_e1;
  char **local_e0;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_x_tiles;
  vector<int,_std::allocator<int>_> num_y_tiles;
  
  local_f4 = -3;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    std::__cxx11::string::string
              ((string *)&e,"Invalid argument for LoadEXRMultipartImageFromMemory()",
               (allocator *)&chunk_offset_table_list);
    tinyexr::SetErrorMessage(&e,err);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    __n = (ulong)num_parts;
    lVar11 = 0;
    for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
      if ((ulong)exr_headers[uVar9]->header_len == 0) {
        std::__cxx11::string::string
                  ((string *)&e,"EXRHeader variable is not initialized.",
                   (allocator *)&chunk_offset_table_list);
        tinyexr::SetErrorMessage(&e,err);
        std::__cxx11::string::~string((string *)&e);
        return -3;
      }
      lVar11 = lVar11 + (ulong)exr_headers[uVar9]->header_len;
    }
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e0 = err;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&chunk_offset_table_list,__n);
    puVar18 = (ulong *)(memory + lVar11 + 9);
    local_f4 = -3;
    for (uVar9 = 0; uVar9 != __n; uVar9 = uVar9 + 1) {
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&chunk_offset_table_list,
                 ((long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      pOVar6 = chunk_offset_table_list.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_finish;
      offset_data = chunk_offset_table_list.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[uVar9];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(offset_data,(long)exr_header->chunk_count);
        plVar5 = *(long **)&(((offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        lVar11 = *plVar5;
        lVar4 = plVar5[1];
        lVar12 = 0;
LAB_002331a5:
        if (lVar4 - lVar11 >> 3 != lVar12) {
          if (*puVar18 < size) goto code_r0x002331b3;
          std::__cxx11::string::string
                    ((string *)&e,"Invalid offset size in EXR header chunks.",
                     (allocator *)&num_x_tiles);
LAB_00233236:
          bVar19 = uVar9 < __n;
          tinyexr::SetErrorMessage(&e,local_e0);
          std::__cxx11::string::~string((string *)&e);
          local_f4 = -4;
          goto LAB_0023325b;
        }
        goto LAB_002331c4;
      }
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tinyexr::PrecalculateTileInfo(&num_x_tiles,&num_y_tiles,exr_header);
      iVar7 = tinyexr::InitTileOffsets(offset_data,exr_headers[uVar9],&num_x_tiles,&num_y_tiles);
      iVar8 = exr_headers[uVar9]->chunk_count;
      if (iVar7 != iVar8) {
        std::__cxx11::string::string((string *)&e,"Invalid offset table size.",&local_e1);
        tinyexr::SetErrorMessage(&e,local_e0);
        std::__cxx11::string::~string((string *)&e);
        local_f4 = -4;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>);
      if (iVar7 != iVar8) goto LAB_002333ad;
      pvVar1 = pOVar6[-1].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = pOVar6[-1].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (uVar15 = 0; uVar14 = (ulong)uVar15,
          uVar14 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18); uVar15 = uVar15 + 1) {
        pvVar3 = *(pointer *)
                  ((long)&pvVar1[uVar14].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl + 8);
        lVar11 = *(long *)&pvVar1[uVar14].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl;
        for (uVar10 = 0; (ulong)uVar10 < (ulong)(((long)pvVar3 - lVar11) / 0x18);
            uVar10 = uVar10 + 1) {
          lVar4 = *(long *)&pvVar1[uVar14].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
          lVar17 = (ulong)uVar10 * 0x18;
          lVar12 = *(long *)(lVar4 + lVar17);
          lVar4 = *(long *)(lVar4 + 8 + lVar17);
          for (uVar16 = 0; (ulong)uVar16 < (ulong)(lVar4 - lVar12 >> 3); uVar16 = uVar16 + 1) {
            if (size <= *puVar18) {
              std::__cxx11::string::string
                        ((string *)&e,"Invalid offset size in EXR header chunks.",
                         (allocator *)&num_x_tiles);
              goto LAB_00233236;
            }
            *(ulong *)(lVar12 + (ulong)uVar16 * 8) = *puVar18 + 4;
            puVar18 = puVar18 + 1;
          }
        }
      }
LAB_002331c4:
    }
    bVar19 = false;
LAB_0023325b:
    if (!bVar19) {
      uVar9 = 0;
      do {
        if (uVar9 == __n) {
          local_f4 = 0;
          break;
        }
        pvVar1 = chunk_offset_table_list.
                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9].offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (uVar15 = 0; uVar14 = (ulong)uVar15,
            uVar14 < (ulong)(((long)chunk_offset_table_list.
                                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9].offsets.
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) /
                            0x18); uVar15 = uVar15 + 1) {
          for (uVar10 = 0;
              (ulong)uVar10 <
              (ulong)(((long)*(pointer *)
                              ((long)&pvVar1[uVar14].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl + 8) -
                      *(long *)&pvVar1[uVar14].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl) / 0x18); uVar10 = uVar10 + 1) {
            lVar11 = *(long *)&pvVar1[uVar14].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl;
            lVar12 = (ulong)uVar10 * 0x18;
            lVar4 = *(long *)(lVar11 + lVar12);
            uVar16 = 0;
            while (uVar13 = (ulong)uVar16,
                  uVar13 < (ulong)(*(long *)(lVar11 + 8 + lVar12) - lVar4 >> 3)) {
              uVar16 = uVar16 + 1;
              if (uVar9 != *(uint *)(memory + *(long *)(lVar4 + uVar13 * 8) + -4)) {
                std::__cxx11::string::string
                          ((string *)&e,"Invalid `part number\' in EXR header chunks.",
                           (allocator *)&num_x_tiles);
                tinyexr::SetErrorMessage(&e,local_e0);
                std::__cxx11::string::~string((string *)&e);
                local_f4 = -4;
                goto LAB_002333ad;
              }
            }
          }
        }
        e._M_dataplus._M_p = (pointer)&e.field_2;
        e._M_string_length = 0;
        e.field_2._M_local_buf[0] = '\0';
        iVar8 = tinyexr::DecodeChunk
                          (exr_images + uVar9,exr_headers[uVar9],
                           chunk_offset_table_list.
                           super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar9,memory,size,&e);
        if ((iVar8 != 0) && (local_f4 = iVar8, e._M_string_length != 0)) {
          tinyexr::SetErrorMessage(&e,local_e0);
        }
        std::__cxx11::string::~string((string *)&e);
        uVar9 = uVar9 + 1;
      } while (iVar8 == 0);
    }
LAB_002333ad:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              (&chunk_offset_table_list);
  }
  return local_f4;
code_r0x002331b3:
  *(ulong *)(lVar11 + lVar12 * 8) = *puVar18 + 4;
  puVar18 = puVar18 + 1;
  lVar12 = lVar12 + 1;
  goto LAB_002331a5;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}